

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exponentiation.h
# Opt level: O0

ptr<Value> __thiscall
Exponentiation::asBooleans(Exponentiation *this,bool leftOperand,bool rightOperand)

{
  byte in_CL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  ptr<Value> pVar1;
  shared_ptr<Boolean> local_30;
  undefined1 local_1a;
  undefined1 local_19;
  bool rightOperand_local;
  undefined8 uStack_18;
  bool leftOperand_local;
  Exponentiation *this_local;
  
  uStack_18 = CONCAT71(in_register_00000031,leftOperand);
  local_1a = in_CL & 1;
  local_19 = rightOperand;
  this_local = this;
  std::pow<bool,bool>(rightOperand,(bool)local_1a);
  make<Boolean,double>((double *)&local_30);
  std::shared_ptr<Value>::shared_ptr<Boolean,void>((shared_ptr<Value> *)this,&local_30);
  std::shared_ptr<Boolean>::~shared_ptr(&local_30);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asBooleans(bool leftOperand, bool rightOperand) override {
        return make<Boolean>(std::pow(leftOperand, rightOperand));
    }